

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

runtime_type<> * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
reentrant_put_transaction<void>::complete_type(reentrant_put_transaction<void> *this)

{
  bool bVar1;
  runtime_type<> *prVar2;
  reentrant_put_transaction<void> *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>("!empty()",anon_var_dwarf_12e55,0x6f8);
  }
  prVar2 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           type_after_control((this->m_put_data).m_control_block);
  return prVar2;
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *type_after_control(m_put_data.m_control_block);
            }